

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void __thiscall swrenderer::FCoverageBuffer::FCoverageBuffer(FCoverageBuffer *this,int lists)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Span **ppSVar3;
  int lists_local;
  FCoverageBuffer *this_local;
  
  FMemArena::FMemArena(&this->SpanArena,0x2800);
  this->Spans = (Span **)0x0;
  this->FreeSpans = (Span *)0x0;
  this->NumLists = lists;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)lists;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppSVar3 = (Span **)operator_new__(uVar2);
  this->Spans = ppSVar3;
  memset(this->Spans,0,(long)lists << 3);
  return;
}

Assistant:

FCoverageBuffer::FCoverageBuffer(int lists)
	: Spans(NULL), FreeSpans(NULL)
{
	NumLists = lists;
	Spans = new Span *[lists];
	memset(Spans, 0, sizeof(Span*)*lists);
}